

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O2

void DepParserTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  uint uVar7;
  vw *pvVar8;
  undefined8 *__s;
  typed_option<unsigned_long> *ptVar9;
  typed_option<unsigned_int> *ptVar10;
  example *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined **ppuVar11;
  char **ppcVar12;
  long lVar13;
  byte bVar14;
  allocator_type local_659;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_658;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_638;
  vw *local_620;
  char *triple [12];
  char *local_5b8;
  bool *local_5b0;
  char *pair [19];
  char *local_510;
  option_group_definition new_options;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  typed_option<bool> local_3f0;
  typed_option<bool> local_350;
  typed_option<bool> local_2b0;
  typed_option<unsigned_int> local_210;
  typed_option<unsigned_int> local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar14 = 0;
  pvVar8 = Search::search::get_vw_pointer_unsafe(sch);
  __s = (undefined8 *)operator_new(0x2c8);
  memset(__s,0,0x2c8);
  v_array<unsigned_int>::resize((v_array<unsigned_int> *)(__s + 7),5);
  *__s = 0;
  sch->task_data = __s;
  std::__cxx11::string::string((string *)&local_410,"Dependency Parser Options",(allocator *)pair);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string((string *)&local_430,"root_label",(allocator *)&local_638);
  local_620 = pvVar8;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)pair,&local_430,__s + 1);
  pair[0xe]._0_1_ = 1;
  ptVar9 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)pair,8);
  std::__cxx11::string::string
            ((string *)triple,"Ensure that there is only one root in each sentence",
             (allocator *)&local_658);
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,ptVar9);
  VW::config::option_group_definition::add<unsigned_long>(&new_options,&local_d0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_d0);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)pair);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::string((string *)&local_450,"num_label",(allocator *)&local_638);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)pair,&local_450,(uint *)(__s + 2));
  pair[0xe]._0_1_ = 1;
  ptVar10 = VW::config::typed_option<unsigned_int>::default_value
                      ((typed_option<unsigned_int> *)pair,0xc);
  std::__cxx11::string::string((string *)triple,"Number of arc labels",(allocator *)&local_658);
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<unsigned_int>::typed_option(&local_170,ptVar10);
  VW::config::option_group_definition::add<unsigned_int>(&new_options,&local_170);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_170);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)pair);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::string((string *)&local_470,"transition_system",(allocator *)&local_638);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)pair,&local_470,(uint *)((long)__s + 0x2c4));
  pair[0xe]._0_1_ = 1;
  ptVar10 = VW::config::typed_option<unsigned_int>::default_value
                      ((typed_option<unsigned_int> *)pair,1);
  std::__cxx11::string::string
            ((string *)triple,"1: arc-hybrid 2: arc-eager",(allocator *)&local_658);
  std::__cxx11::string::_M_assign((string *)&(ptVar10->super_base_option).m_help);
  VW::config::typed_option<unsigned_int>::typed_option(&local_210,ptVar10);
  VW::config::option_group_definition::add<unsigned_int>(&new_options,&local_210);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_210);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)pair);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string((string *)&local_490,"one_learner",(allocator *)&local_638);
  local_5b0 = (bool *)((long)__s + 0x2c2);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)pair,&local_490,local_5b0);
  pair[0xe]._0_1_ = 1;
  std::__cxx11::string::string
            ((string *)triple,"Using one learner instead of three learners for labeled parser",
             (allocator *)&local_658);
  std::__cxx11::string::_M_assign((string *)(pair + 6));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)pair);
  VW::config::option_group_definition::add<bool>(&new_options,&local_2b0);
  VW::config::typed_option<bool>::~typed_option(&local_2b0);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)pair);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::string((string *)&local_4b0,"cost_to_go",(allocator *)&local_638);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)pair,&local_4b0,(bool *)((long)__s + 0x2c1));
  pair[0xe]._0_1_ = 1;
  std::__cxx11::string::string
            ((string *)triple,
             "Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out",
             (allocator *)&local_658);
  std::__cxx11::string::_M_assign((string *)(pair + 6));
  VW::config::typed_option<bool>::typed_option(&local_350,(typed_option<bool> *)pair);
  VW::config::option_group_definition::add<bool>(&new_options,&local_350);
  VW::config::typed_option<bool>::~typed_option(&local_350);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)pair);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::string((string *)&local_4d0,"old_style_labels",(allocator *)&local_638);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)pair,&local_4d0,(bool *)(__s + 0x58));
  pair[0xe]._0_1_ = 1;
  std::__cxx11::string::string
            ((string *)triple,"Use old hack of label information",(allocator *)&local_658);
  std::__cxx11::string::_M_assign((string *)(pair + 6));
  VW::config::typed_option<bool>::typed_option(&local_3f0,(typed_option<bool> *)pair);
  VW::config::option_group_definition::add<bool>(&new_options,&local_3f0);
  VW::config::typed_option<bool>::~typed_option(&local_3f0);
  std::__cxx11::string::~string((string *)triple);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)pair);
  std::__cxx11::string::~string((string *)&local_4d0);
  (**options->_vptr_options_i)(options,&new_options);
  this = VW::alloc_examples(0x28,1);
  *__s = this;
  pair[0]._0_1_ = 'd';
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this,(uchar *)pair);
  pvVar8 = local_620;
  for (lVar13 = -0xd; lVar13 != 0; lVar13 = lVar13 + 1) {
    pair[0]._0_1_ = (char)lVar13 + 'O';
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)*__s,(uchar *)pair);
  }
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)*__s,&constant_namespace);
  Search::search::set_num_learners(sch,(ulong)(*local_5b0 ^ 1) * 2 + 1);
  memcpy(pair,&PTR_anon_var_dwarf_713c34_002c2b00,0x98);
  ppuVar11 = &PTR_anon_var_dwarf_713d13_002c2ba0;
  ppcVar12 = triple;
  for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
    *ppcVar12 = *ppuVar11;
    ppuVar11 = ppuVar11 + (ulong)bVar14 * -2 + 1;
    ppcVar12 = ppcVar12 + (ulong)bVar14 * -2 + 1;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_638,pair,
             &local_510,(allocator_type *)&local_658);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_658,triple,
             &local_5b8,&local_659);
  pbVar1 = (pvVar8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar8->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_638.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar3 = (pvVar8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (pvVar8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pvVar8->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_638.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pvVar8->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_638.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (pvVar8->triples).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar8->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_658.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar5 = (pvVar8->triples).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (pvVar8->triples).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pvVar8->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_658.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pvVar8->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_658.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &local_620->interactions;
  local_658.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar5;
  local_658.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
  local_658.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar2;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar3;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (pvVar8->interactions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pvVar8->pairs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pvVar8->pairs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (pvVar8->interactions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pvVar8->triples).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pvVar8->triples).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  uVar7 = 0;
  if (*(bool *)((long)__s + 0x2c1) != false) {
    uVar7 = Search::ACTION_COSTS;
  }
  Search::search::set_options(sch,Search::NO_CACHING | Search::AUTO_CONDITION_FEATURES | uVar7);
  Search::search::set_label_parser
            (sch,(label_parser *)&COST_SENSITIVE::cs_label,
             initialize::anon_class_1_0_00000001::__invoke);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_658);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_638);
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search &sch, size_t & /*num_actions*/, options_i &options)
{
  vw &all = sch.get_vw_pointer_unsafe();
  task_data *data = new task_data();
  data->action_loss.resize(5);
  data->ex = NULL;
  sch.set_task_data<task_data>(data);

  option_group_definition new_options("Dependency Parser Options");
  new_options.add(make_option("root_label", data->root_label)
                      .keep()
                      .default_value(8)
                      .help("Ensure that there is only one root in each sentence"));
  new_options.add(make_option("num_label", data->num_label).keep().default_value(12).help("Number of arc labels"));
  new_options.add(make_option("transition_system", data->transition_system)
                      .keep()
                      .default_value(1)
                      .help("1: arc-hybrid 2: arc-eager"));
  new_options.add(make_option("one_learner", data->one_learner)
                      .keep()
                      .help("Using one learner instead of three learners for labeled parser"));
  new_options.add(make_option("cost_to_go", data->cost_to_go)
                      .keep()
                      .help("Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out"));
  new_options.add(
      make_option("old_style_labels", data->old_style_labels).keep().help("Use old hack of label information"));
  options.add_and_parse(new_options);

  data->ex = VW::alloc_examples(sizeof(polylabel), 1);
  data->ex->indices.push_back(val_namespace);
  for (size_t i = 1; i < 14; i++) data->ex->indices.push_back((unsigned char)i + 'A');
  data->ex->indices.push_back(constant_namespace);

  if (data->one_learner)
    sch.set_num_learners(1);
  else
    sch.set_num_learners(3);

  const char *pair[] = {
      "BC", "BE", "BB", "CC", "DD", "EE", "FF", "GG", "EF", "BH", "BJ", "EL", "dB", "dC", "dD", "dE", "dF", "dG", "dd"};
  const char *triple[] = {"EFG", "BEF", "BCE", "BCD", "BEL", "ELM", "BHI", "BCC", "BEJ", "BEH", "BJK", "BEN"};
  vector<string> newpairs(pair, pair + 19);
  vector<string> newtriples(triple, triple + 12);
  all.pairs.swap(newpairs);
  all.triples.swap(newtriples);

  all.interactions.clear();
  all.interactions.insert(std::end(all.interactions), std::begin(all.pairs), std::end(all.pairs));
  all.interactions.insert(std::end(all.interactions), std::begin(all.triples), std::end(all.triples));
  if (data->cost_to_go)
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING | ACTION_COSTS);
  else
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING);

  sch.set_label_parser(COST_SENSITIVE::cs_label, [](polylabel &l) -> bool { return l.cs.costs.size() == 0; });
}